

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

int drmp3dec_decode_frame
              (drmp3dec *dec,uchar *mp3,int mp3_bytes,void *pcm,drmp3dec_frame_info *info)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  int in_EDX;
  drmp3_uint8 *in_RSI;
  drmp3dec *in_RDI;
  int *in_R8;
  drmp3_L12_scale_info sci [1];
  int main_data_begin;
  drmp3dec_scratch scratch;
  drmp3_bs bs_frame [1];
  drmp3_uint8 *hdr;
  int success;
  int frame_size;
  int igr;
  int i;
  drmp3dec_scratch *in_stack_ffffffffffffbc88;
  undefined4 in_stack_ffffffffffffbc90;
  int in_stack_ffffffffffffbc94;
  undefined4 in_stack_ffffffffffffbc98;
  int in_stack_ffffffffffffbc9c;
  int in_stack_ffffffffffffbca0;
  int in_stack_ffffffffffffbca4;
  undefined4 in_stack_ffffffffffffbca8;
  int in_stack_ffffffffffffbcac;
  drmp3dec *in_stack_ffffffffffffbcb0;
  undefined4 in_stack_ffffffffffffbcb8;
  int in_stack_ffffffffffffbcbc;
  undefined4 in_stack_ffffffffffffbcc0;
  int in_stack_ffffffffffffbcc4;
  drmp3_bs *in_stack_ffffffffffffbcc8;
  drmp3dec *in_stack_ffffffffffffbcd0;
  drmp3_bs *in_stack_ffffffffffffbcd8;
  drmp3_uint8 *in_stack_ffffffffffffbce0;
  undefined1 auStack_3448 [13296];
  drmp3_bs local_58;
  drmp3_uint8 *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int *local_30;
  long local_28;
  int local_1c;
  drmp3_uint8 *local_18;
  drmp3dec *local_10;
  
  local_34 = 0;
  local_3c = 0;
  local_40 = 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (((4 < in_EDX) && (in_RDI->header[0] == 0xff)) &&
     (iVar1 = drmp3_hdr_compare((drmp3_uint8 *)
                                CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90),
                                (drmp3_uint8 *)in_stack_ffffffffffffbc88), iVar1 != 0)) {
    in_stack_ffffffffffffbc94 =
         drmp3_hdr_frame_bytes
                   ((drmp3_uint8 *)CONCAT44(in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0),
                    in_stack_ffffffffffffbc9c);
    local_3c = drmp3_hdr_padding(local_18);
    local_3c = in_stack_ffffffffffffbc94 + local_3c;
    if ((local_3c != local_1c) &&
       ((local_1c < local_3c + 4 ||
        (iVar1 = drmp3_hdr_compare((drmp3_uint8 *)
                                   CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90),
                                   (drmp3_uint8 *)in_stack_ffffffffffffbc88), iVar1 == 0)))) {
      local_3c = 0;
    }
  }
  if (local_3c == 0) {
    memset(local_10,0,0x1a0c);
    local_34 = drmp3d_find_frame((drmp3_uint8 *)in_stack_ffffffffffffbcc8,in_stack_ffffffffffffbcc4,
                                 (int *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8
                                                ),(int *)in_stack_ffffffffffffbcb0);
    if ((local_3c == 0) || (local_1c < local_34 + local_3c)) {
      *local_30 = local_34;
      return 0;
    }
  }
  local_48 = local_18 + local_34;
  *(undefined4 *)local_10->header = *(undefined4 *)local_48;
  *local_30 = local_34 + local_3c;
  iVar1 = 2;
  if ((local_48[3] & 0xc0) == 0xc0) {
    iVar1 = 1;
  }
  local_30[1] = iVar1;
  uVar2 = drmp3_hdr_sample_rate_hz(local_48);
  local_30[2] = uVar2;
  local_30[3] = 4 - ((int)(uint)local_48[1] >> 1 & 3U);
  uVar2 = drmp3_hdr_bitrate_kbps(local_48);
  local_30[4] = uVar2;
  drmp3_bs_init(&local_58,local_48 + 4,local_3c + -4);
  if ((local_48[1] & 1) == 0) {
    drmp3_bs_get_bits(&local_58,0x10);
  }
  if (local_30[3] == 3) {
    iVar1 = drmp3_L3_read_side_info
                      ((drmp3_bs *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                       (drmp3_L3_gr_info *)in_stack_ffffffffffffbcb0,
                       (drmp3_uint8 *)CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8))
    ;
    if ((iVar1 < 0) || (local_58.limit < local_58.pos)) {
      drmp3dec_init(local_10);
      return 0;
    }
    local_40 = drmp3_L3_restore_reservoir
                         (in_stack_ffffffffffffbcd0,in_stack_ffffffffffffbcc8,
                          (drmp3dec_scratch *)
                          CONCAT44(in_stack_ffffffffffffbcc4,in_stack_ffffffffffffbcc0),
                          in_stack_ffffffffffffbcbc);
    if ((local_40 != 0) && (local_28 != 0)) {
      local_38 = 0;
      while( true ) {
        iVar1 = 1;
        if ((local_48[1] & 8) != 0) {
          iVar1 = 2;
        }
        if (iVar1 <= local_38) break;
        memset(auStack_3448,0,0x1200);
        drmp3_L3_decode(in_stack_ffffffffffffbcb0,
                        (drmp3dec_scratch *)
                        CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8),
                        (drmp3_L3_gr_info *)
                        CONCAT44(in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0),
                        in_stack_ffffffffffffbc9c);
        drmp3d_synth_granule
                  ((float *)in_stack_ffffffffffffbcb0,
                   (float *)CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8),
                   in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0,
                   (drmp3d_sample_t *)CONCAT44(in_stack_ffffffffffffbc9c,in_stack_ffffffffffffbc98),
                   (float *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90));
        local_38 = local_38 + 1;
        local_28 = local_28 + (long)local_30[1] * 0x480;
      }
    }
    drmp3_L3_save_reservoir
              ((drmp3dec *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90),
               in_stack_ffffffffffffbc88);
  }
  else {
    if (local_28 == 0) {
      uVar2 = drmp3_hdr_frame_samples(local_48);
      return uVar2;
    }
    drmp3_L12_read_scale_info
              (in_stack_ffffffffffffbce0,in_stack_ffffffffffffbcd8,
               (drmp3_L12_scale_info *)in_stack_ffffffffffffbcd0);
    memset(auStack_3448,0,0x1200);
    local_34 = 0;
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      iVar1 = drmp3_L12_dequantize_granule
                        ((float *)CONCAT44(in_stack_ffffffffffffbcc4,in_stack_ffffffffffffbcc0),
                         (drmp3_bs *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                         (drmp3_L12_scale_info *)in_stack_ffffffffffffbcb0,in_stack_ffffffffffffbcac
                        );
      local_34 = iVar1 + local_34;
      if (local_34 == 0xc) {
        local_34 = 0;
        drmp3_L12_apply_scf_384
                  ((drmp3_L12_scale_info *)
                   CONCAT44(in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0),
                   (float *)CONCAT44(in_stack_ffffffffffffbc9c,in_stack_ffffffffffffbc98),
                   (float *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90));
        drmp3d_synth_granule
                  ((float *)in_stack_ffffffffffffbcb0,
                   (float *)CONCAT44(in_stack_ffffffffffffbcac,in_stack_ffffffffffffbca8),
                   in_stack_ffffffffffffbca4,in_stack_ffffffffffffbca0,
                   (drmp3d_sample_t *)CONCAT44(in_stack_ffffffffffffbc9c,in_stack_ffffffffffffbc98),
                   (float *)CONCAT44(in_stack_ffffffffffffbc94,in_stack_ffffffffffffbc90));
        memset(auStack_3448,0,0x1200);
        local_28 = local_28 + (long)local_30[1] * 0x300;
      }
      if (local_58.limit < local_58.pos) {
        drmp3dec_init(local_10);
        return 0;
      }
    }
  }
  uVar2 = drmp3_hdr_frame_samples(local_10->header);
  return local_40 * uVar2;
}

Assistant:

int drmp3dec_decode_frame(drmp3dec *dec, const unsigned char *mp3, int mp3_bytes, void *pcm, drmp3dec_frame_info *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const drmp3_uint8 *hdr;
    drmp3_bs bs_frame[1];
    drmp3dec_scratch scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && drmp3_hdr_compare(dec->header, mp3))
    {
        frame_size = drmp3_hdr_frame_bytes(mp3, dec->free_format_bytes) + drmp3_hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + DRMP3_HDR_SIZE > mp3_bytes || !drmp3_hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(drmp3dec));
        i = drmp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, DRMP3_HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = DRMP3_HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = drmp3_hdr_sample_rate_hz(hdr);
    info->layer = 4 - DRMP3_HDR_GET_LAYER(hdr);
    info->bitrate_kbps = drmp3_hdr_bitrate_kbps(hdr);

    drmp3_bs_init(bs_frame, hdr + DRMP3_HDR_SIZE, frame_size - DRMP3_HDR_SIZE);
    if (DRMP3_HDR_IS_CRC(hdr))
    {
        drmp3_bs_get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = drmp3_L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            drmp3dec_init(dec);
            return 0;
        }
        success = drmp3_L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success && pcm != NULL)
        {
            for (igr = 0; igr < (DRMP3_HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*576*info->channels))
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                drmp3_L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
            }
        }
        drmp3_L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef DR_MP3_ONLY_MP3
        return 0;
#else
        if (pcm == NULL) {
            return drmp3_hdr_frame_samples(hdr);
        }

        drmp3_L12_scale_info sci[1];
        drmp3_L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += drmp3_L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                drmp3_L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*384*info->channels);
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                drmp3dec_init(dec);
                return 0;
            }
        }
#endif
    }

    return success*drmp3_hdr_frame_samples(dec->header);
}